

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O0

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::RemoveDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob **ppDstArchive)

{
  type DeviceFlag;
  DeviceType Dev;
  Char *pCVar1;
  DeviceType ArchiveDeviceType;
  type DataTypeFlag;
  Uint32 local_198;
  bool local_194;
  undefined1 local_190 [8];
  DeviceObjectArchive ObjectArchive;
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  IDataBlob **ppDstArchive_local;
  IDataBlob *pIStack_20;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags_local;
  IDataBlob *pSrcArchive_local;
  ArchiverFactoryImpl *this_local;
  
  msg.field_2._8_8_ = ppDstArchive;
  ppDstArchive_local._4_4_ = DeviceFlags;
  pIStack_20 = pSrcArchive;
  pSrcArchive_local = (IDataBlob *)this;
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)local_50,(char (*) [29])"pSrcArchive must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xdc);
    std::__cxx11::string::~string((string *)local_50);
    this_local._7_1_ = 0;
  }
  else if (ppDstArchive == (IDataBlob **)0x0) {
    FormatString<char[30]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [30])"ppDstArchive must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"RemoveDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0xe1);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    this_local._7_1_ = 0;
  }
  else {
    if (*ppDstArchive != (IDataBlob *)0x0) {
      FormatString<char[27]>
                ((string *)&ObjectArchive.m_ContentVersion,
                 (char (*) [27])"*ppDstArchive must be null");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"RemoveDeviceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0xe4);
      std::__cxx11::string::~string((string *)&ObjectArchive.m_ContentVersion);
    }
    _ArchiveDeviceType = pIStack_20;
    local_198 = 0xffffffff;
    local_194 = false;
    DeviceObjectArchive::DeviceObjectArchive
              ((DeviceObjectArchive *)local_190,(CreateInfo *)&ArchiveDeviceType);
    while (ppDstArchive_local._4_4_ != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
      DeviceFlag = ExtractLSB<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>
                             ((ARCHIVE_DEVICE_DATA_FLAGS *)((long)&ppDstArchive_local + 4));
      Dev = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
      DeviceObjectArchive::RemoveDeviceData((DeviceObjectArchive *)local_190,Dev);
    }
    DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_190,(IDataBlob **)msg.field_2._8_8_)
    ;
    this_local._7_1_ = *(long *)msg.field_2._8_8_ != 0;
    DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_190);
  }
  return (Bool)(this_local._7_1_ & 1);
}

Assistant:

Bool ArchiverFactoryImpl::RemoveDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.RemoveDeviceData(ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}